

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_parser.cpp
# Opt level: O2

void __thiscall
Assignment_Reassignment_Test::Assignment_Reassignment_Test(Assignment_Reassignment_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00198328;
  return;
}

Assistant:

TEST(Assignment, Reassignment) {
	MockParser mock(
		"let a = 3\n"
		"let b = 4\n"
		"a = 5\n"
		"b = 6\n"
		"b = a\n"
		"a = b + 7\n" // Relocatable expressions
		"a = -b\n"
	);

	INS2(BC_SET_N, 0, 0);
	INS2(BC_SET_N, 1, 1);

	INS2(BC_SET_N, 0, 2);
	INS2(BC_SET_N, 1, 3);
	INS2(BC_MOV, 1, 0);

	INS(BC_ADD_LN, 0, 1, 4);
	INS2(BC_NEG, 0, 1);

	INS(BC_RET, 0, 0, 0);
}